

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

int mspace_trim(mspace msp,size_t pad)

{
  char *__addr;
  int iVar1;
  ulong uVar2;
  msegmentptr pmVar3;
  size_t sVar4;
  char *pcVar5;
  void *pvVar6;
  ulong uVar7;
  ulong __len;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  sVar4 = mparams.granularity;
  if (0xffffffffffffff7f < pad) {
    return 0;
  }
  if (*(char **)((long)msp + 0x28) == (char *)0x0) {
    return 0;
  }
  if (pad + 0x50 < *(ulong *)((long)msp + 0x10)) {
    uVar2 = (((*(ulong *)((long)msp + 0x10) - pad) + mparams.granularity) - 0x51) /
            mparams.granularity;
    pmVar3 = segment_holding((mstate)msp,*(char **)((long)msp + 0x28));
    uVar7 = 0;
    if ((pmVar3->sflags & 9) != 1) goto LAB_00104881;
    __len = (uVar2 - 1) * sVar4;
    uVar2 = pmVar3->size;
    if (__len <= uVar2) {
      pcVar5 = (char *)((long)msp + 0x378);
      __addr = pmVar3->base;
      do {
        uVar7 = 0;
        if (__addr <= pcVar5 && pcVar5 < __addr + uVar2) goto LAB_00104881;
        pcVar5 = *(char **)(pcVar5 + 0x10);
      } while (pcVar5 != (char *)0x0);
      pvVar6 = mremap(__addr,uVar2,uVar2 - __len,0);
      if (pvVar6 == (void *)0xffffffffffffffff) {
        iVar1 = munmap(pmVar3->base + (uVar2 - __len),__len);
        uVar7 = 0;
        if ((__len == 0) || (iVar1 != 0)) goto LAB_00104881;
      }
      else if (__len == 0) goto LAB_0010487e;
      pmVar3->size = pmVar3->size - __len;
      *(long *)((long)msp + 0x358) = *(long *)((long)msp + 0x358) - __len;
      init_top((mstate)msp,*(mchunkptr *)((long)msp + 0x28),*(long *)((long)msp + 0x10) - __len);
      uVar7 = __len;
      goto LAB_00104881;
    }
  }
LAB_0010487e:
  uVar7 = 0;
LAB_00104881:
  sVar4 = release_unused_segments((mstate)msp);
  if (sVar4 + uVar7 == 0) {
    iVar1 = 0;
    if (*(ulong *)((long)msp + 0x30) < *(ulong *)((long)msp + 0x10)) {
      *(undefined8 *)((long)msp + 0x30) = 0xffffffffffffffff;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int mspace_trim(mspace msp, size_t pad) {
  int result = 0;
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    if (!PREACTION(ms)) {
      result = sys_trim(ms, pad);
      POSTACTION(ms);
    }
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return result;
}